

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtab.c
# Opt level: O2

void StrTab_Clear(strtab *p)

{
  cc_memheap *pcVar1;
  void *pvVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  
  pcVar3 = (p->Table)._Begin;
  for (pcVar5 = pcVar3; pcVar5 != pcVar3 + ((p->Table)._Used & 0xfffffffffffffff8);
      pcVar5 = pcVar5 + 8) {
    pcVar1 = p->Heap;
    pvVar2 = *(void **)pcVar5;
    sVar4 = tcsbytes((tchar_t *)((long)pvVar2 + 8));
    (*pcVar1->Free)(pcVar1,pvVar2,sVar4 + 8);
    pcVar3 = (p->Table)._Begin;
  }
  ArrayClear(&p->Table);
  return;
}

Assistant:

static NOINLINE void StrTab_Clear(strtab* p)
{
	stringdef **i;
	for (i=ARRAYBEGIN(p->Table,stringdef*);i!=ARRAYEND(p->Table,stringdef*);++i)
        MemHeap_Free(p->Heap,*i,sizeof(stringdef)+tcsbytes((tchar_t*)(*i+1)));
    ArrayClear(&p->Table);
}